

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda_rpa.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double in_XMM1_Qa;
  double t287;
  double t286;
  double t284;
  double t283;
  double t282;
  double t280;
  double t277;
  double t276;
  double t273;
  double t270;
  double t269;
  double t268;
  double t266;
  double t265;
  double t264;
  double t263;
  double t260;
  double t258;
  double t257;
  double t255;
  double t254;
  double t253;
  double t251;
  double t249;
  double t248;
  double t242;
  double t236;
  double t234;
  double t233;
  double t232;
  double t228;
  double t224;
  double t223;
  double t222;
  double t216;
  double t210;
  double t208;
  double t207;
  double t206;
  double t199;
  double t198;
  double t197;
  double t195;
  double t192;
  double t191;
  double t188;
  double t187;
  double t186;
  double t185;
  double t184;
  double t183;
  double t182;
  double t181;
  double t180;
  double t179;
  double t178;
  double t177;
  double t176;
  double t175;
  double t174;
  double t173;
  double t167;
  double t165;
  double t160;
  double t159;
  double t157;
  double t156;
  double t155;
  double t154;
  double t153;
  double t152;
  double t149;
  double t145;
  double t143;
  double t140;
  double t139;
  double t138;
  double t135;
  double t133;
  double t132;
  double t128;
  double t127;
  double t126;
  double t110;
  double t103;
  double t102;
  double t98;
  double t97;
  double t96;
  double t80;
  double t74;
  double t73;
  double t69;
  double t68;
  double t66;
  double t65;
  double t64;
  double t63;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t56;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t46;
  double t45;
  double t44;
  double t40;
  double t39;
  double t38;
  double t35;
  double t31;
  double t23;
  double t22;
  double t16;
  double t13;
  double t12;
  double t11;
  double t10;
  double t259;
  double t227;
  double t226;
  double t201;
  double t147;
  double t134;
  double t125;
  double t120;
  double t117;
  double t113;
  double t112;
  double t107;
  double t106;
  double t105;
  double t95;
  double t90;
  double t87;
  double t83;
  double t82;
  double t77;
  double t76;
  double t75;
  double t37;
  double t30;
  double t27;
  double t20;
  double t19;
  double t18;
  double t9;
  double t8;
  double t4;
  double t2;
  double t1;
  double t70;
  double t7;
  double t6;
  double t3;
  double dVar33;
  double in_stack_fffffffffffffa90;
  double dVar34;
  
  dVar1 = in_XMM0_Qa + in_XMM1_Qa;
  dVar2 = safe_math::cbrt<double>(9.77584966406366e-318);
  dVar3 = (1.0 / dVar2) * 1.720508027656199;
  dVar33 = 0.25;
  dVar4 = dVar3 * 0.11895241781024411 * 0.25 + 1.0;
  dVar5 = safe_math::sqrt<double>(9.77670439763096e-318);
  dVar6 = pow_3_2<double>(in_stack_fffffffffffffa90);
  dVar7 = safe_math::pow<double,double>(in_stack_fffffffffffffa90,dVar33);
  dVar8 = dVar6 * 0.02955875 + dVar5 * 5.1486 * 0.5 + dVar3 * 2.3772599667377015 * dVar33 +
          dVar7 * 0.20614;
  dVar9 = safe_math::log<double>(9.77814706931682e-318);
  dVar10 = dVar4 * 0.031091 * dVar9;
  dVar11 = dVar10 + dVar10;
  dVar12 = in_XMM0_Qa - in_XMM1_Qa;
  dVar13 = dVar12 * dVar12;
  dVar14 = dVar1 * dVar1;
  dVar15 = 1.0 / (dVar14 * dVar14);
  dVar16 = dVar13 * dVar13 * dVar15;
  dVar17 = 1.0 / dVar1;
  dVar18 = dVar12 * dVar17 + 1.0;
  dVar34 = 1e-15;
  dVar32 = (double)(-(ulong)(dVar18 <= 1e-15) & 0x3ff0000000000000);
  dVar19 = safe_math::cbrt<double>(9.78004428139685e-318);
  dVar19 = dVar19 * dVar34;
  dVar20 = safe_math::cbrt<double>(9.78029625487623e-318);
  dVar18 = piecewise_functor_3<double>((bool)(-(dVar32 != 0.0) & 1),dVar19,dVar20 * dVar18);
  dVar21 = 1.0 - dVar12 * dVar17;
  dVar22 = (double)(-(ulong)(dVar21 <= dVar34) & 0x3ff0000000000000);
  dVar23 = safe_math::cbrt<double>(9.78110652253541e-318);
  dVar19 = piecewise_functor_3<double>(dVar22 != 0.0,dVar19,dVar23 * dVar21);
  dVar18 = ((dVar18 + dVar19) - 2.0) * 1.9236610509315362;
  dVar19 = (dVar3 * 0.051018136300054265) / 4.0 + 1.0;
  dVar21 = safe_math::pow<double,double>(dVar34,dVar33);
  dVar24 = dVar6 * 0.018975 + (dVar5 * 6.4869) / 2.0 + (dVar3 * 1.8868951128331823) / 4.0 +
           dVar21 * 0.082349;
  dVar25 = safe_math::log<double>(9.78327053006419e-318);
  dVar26 = (dVar3 * 0.04157861286239228) / 4.0 + 1.0;
  dVar33 = safe_math::pow<double,double>(dVar34,dVar33);
  dVar3 = dVar6 * 0.0599875 + (dVar5 * 10.357) / 2.0 + (dVar3 * 5.225414418180771) / 4.0 +
          dVar33 * 0.12279;
  dVar6 = safe_math::log<double>(9.78467861715484e-318);
  dVar10 = dVar10 + dVar10 +
           dVar19 * -0.03109 * dVar25 + -(dVar26 * 0.033774 * dVar6 * 0.5848223397455204);
  dVar34 = dVar18 * dVar10;
  dVar27 = dVar16 * dVar34;
  dVar28 = dVar26 * dVar6 * 0.5848223397455204;
  dVar29 = dVar18 * 2.0 * 0.016887 * dVar28;
  dVar2 = (1.0 / dVar2) / dVar1;
  dVar9 = (dVar2 * 0.006363040213968214 * dVar9) / 6.0;
  dVar5 = 1.0 / dVar5;
  dVar30 = dVar2 * 1.720508027656199;
  dVar31 = safe_math::sqrt<double>(9.78748491002322e-318);
  dVar4 = dVar4 * (1.0 / (dVar8 * dVar8)) *
          ((-(dVar31 * 0.23647 * 1.4422495703074083 * 0.0625) * dVar30 +
           ((-(dVar5 * 5.1486 * 1.4422495703074083) * dVar30) / 12.0 -
           (dVar30 * 2.3772599667377015) / 12.0)) - (dVar7 * 0.20614 * 1.75 * dVar17) / 3.0) *
          (1.0 / ((32.16364864430221 / dVar8) * 0.5 + 1.0));
  dVar7 = dVar13 * dVar12 * dVar15 * dVar34 * 4.0;
  dVar8 = dVar13 * dVar13 * (1.0 / (dVar14 * dVar14 * dVar1)) * dVar34 * 4.0;
  dVar12 = dVar12 * (1.0 / dVar14);
  dVar13 = dVar17 - dVar12;
  dVar14 = piecewise_functor_3<double>(dVar32 != 0.0,0.0,dVar20 * 1.3333333333333333 * dVar13);
  dVar13 = piecewise_functor_3<double>(dVar22 != 0.0,0.0,dVar23 * 1.3333333333333333 * -dVar13);
  dVar13 = (dVar14 + dVar13) * 1.9236610509315362;
  dVar14 = 1.0 / (dVar3 * dVar3);
  dVar15 = (-(dVar31 * 0.4799 * 1.4422495703074083 * 0.0625) * dVar30 +
           ((-(dVar5 * 10.357 * 1.4422495703074083) * dVar30) / 12.0 -
           (dVar30 * 5.225414418180771) / 12.0)) - (dVar33 * 0.12279 * 2.0 * dVar17) / 3.0;
  dVar3 = 1.0 / ((59.217149286433354 / dVar3) / 2.0 + 1.0);
  dVar19 = dVar16 * dVar18 * (dVar26 * dVar14 * dVar15 * dVar3 * 0.5848223397455204 +
                             (((dVar19 * (1.0 / (dVar24 * dVar24)) *
                                ((-(dVar31 * 0.1518 * 1.4422495703074083 * 0.0625) * dVar30 +
                                 ((-(dVar5 * 6.4869 * 1.4422495703074083) * dVar30) / 12.0 -
                                 (dVar30 * 1.8868951128331823) / 12.0)) -
                                (dVar21 * 0.082349 * 1.75 * dVar17) / 3.0) *
                                (1.0 / ((64.3293663557414 / dVar24) / 2.0 + 1.0)) +
                               (dVar2 * 0.0013644952225223869 * dVar25) / 6.0) - dVar9) - dVar4) +
                             (dVar2 * 2.519842099789747 * 0.00047940866078143105 *
                             dVar6 * 0.5848223397455204) / 6.0);
  dVar2 = (dVar18 * 0.0007021380354072183 * dVar2 * 1.720508027656199 * dVar6 * 0.5848223397455204)
          / 6.0;
  dVar3 = dVar18 * dVar26 * dVar14 * dVar15 * dVar3 * 0.5848223397455204;
  dVar12 = -dVar17 - dVar12;
  dVar32 = piecewise_functor_3<double>(dVar32 != 0.0,0.0,dVar20 * 1.3333333333333333 * dVar12);
  dVar6 = piecewise_functor_3<double>(dVar22 != 0.0,0.0,dVar23 * 1.3333333333333333 * -dVar12);
  dVar32 = (dVar32 + dVar6) * 1.9236610509315362;
  *in_RDI = -dVar11 + dVar27 + dVar29;
  *in_RSI = dVar1 * (((((dVar9 + dVar4 + dVar7) - dVar8) + dVar16 * dVar13 * dVar10 + dVar19 +
                      dVar13 * 0.016887 * dVar28 * 2.0) - dVar2) - dVar3) +
            -dVar11 + dVar27 + dVar29;
  *in_RDX = dVar1 * ((((((dVar9 + dVar4) - dVar7) - dVar8) + dVar16 * dVar32 * dVar10 + dVar19 +
                      dVar32 * 0.016887 * dVar28 * 2.0) - dVar2) - dVar3) +
            -dVar11 + dVar27 + dVar29;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t70 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t18 = 0.1e1 / t1;
    constexpr double t19 = beta1_0;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = beta2_0 * t3;
    constexpr double t30 = beta3_0;
    constexpr double t37 = pp_0 + 0.1e1;
    constexpr double t75 = a_1;
    constexpr double t76 = alpha1_1;
    constexpr double t77 = t76 * t3;
    constexpr double t82 = 0.1e1 / t75;
    constexpr double t83 = beta1_1;
    constexpr double t87 = beta2_1 * t3;
    constexpr double t90 = beta3_1;
    constexpr double t95 = pp_1 + 0.1e1;
    constexpr double t105 = a_2;
    constexpr double t106 = alpha1_2;
    constexpr double t107 = t106 * t3;
    constexpr double t112 = 0.1e1 / t105;
    constexpr double t113 = beta1_2;
    constexpr double t117 = beta2_2 * t3;
    constexpr double t120 = beta3_2;
    constexpr double t125 = pp_2 + 0.1e1;
    constexpr double t134 = 0.1e1 / fz20;
    constexpr double t147 = t1 * t2 * t3;
    constexpr double t201 = t75 * t76 * t3;
    constexpr double t226 = t105 * t106;
    constexpr double t227 = t226 * t20;
    constexpr double t259 = t226 * t3;


    const double t10 = rho_a + rho_b;
    const double t11 = safe_math::cbrt( t10 );
    const double t12 = 0.1e1 / t11;
    const double t13 = t9 * t12;
    const double t16 = 0.1e1 + t4 * t13 / 0.4e1;
    const double t22 = t20 * t8 * t12;
    const double t23 = safe_math::sqrt( t22 );
    const double t31 = pow_3_2( t22 );
    const double t35 = t22 / 0.4e1;
    const double t38 = safe_math::pow( t35, t37 );
    const double t39 = beta4_0 * t38;
    const double t40 = t19 * t23 / 0.2e1 + t27 * t13 / 0.4e1 + 0.125e0 * t30 * t31 + t39;
    const double t44 = 0.1e1 + t18 / t40 / 0.2e1;
    const double t45 = safe_math::log( t44 );
    const double t46 = t1 * t16 * t45;
    const double t47 = 0.2e1 * t46;
    const double t48 = rho_a - rho_b;
    const double t49 = t48 * t48;
    const double t50 = t49 * t49;
    const double t51 = t10 * t10;
    const double t52 = t51 * t51;
    const double t53 = 0.1e1 / t52;
    const double t54 = t50 * t53;
    const double t55 = 0.1e1 / t10;
    const double t56 = t48 * t55;
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( zeta_tol );
    const double t60 = t59 * zeta_tol;
    const double t61 = safe_math::cbrt( t57 );
    const double t63 = piecewise_functor_3( t58, t60, t61 * t57 );
    const double t64 = 0.1e1 - t56;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t60, t66 * t64 );
    const double t69 = t63 + t68 - 0.2e1;
    const double t73 = 0.1e1 / ( 0.2e1 * t70 - 0.2e1 );
    const double t74 = t69 * t73;
    const double t80 = 0.1e1 + t77 * t13 / 0.4e1;
    const double t96 = safe_math::pow( t35, t95 );
    const double t97 = beta4_1 * t96;
    const double t98 = t83 * t23 / 0.2e1 + t87 * t13 / 0.4e1 + 0.125e0 * t90 * t31 + t97;
    const double t102 = 0.1e1 + t82 / t98 / 0.2e1;
    const double t103 = safe_math::log( t102 );
    const double t110 = 0.1e1 + t107 * t13 / 0.4e1;
    const double t126 = safe_math::pow( t35, t125 );
    const double t127 = beta4_2 * t126;
    const double t128 = t113 * t23 / 0.2e1 + t117 * t13 / 0.4e1 + 0.125e0 * t120 * t31 + t127;
    const double t132 = 0.1e1 + t112 / t128 / 0.2e1;
    const double t133 = safe_math::log( t132 );
    const double t135 = t133 * t134;
    const double t138 = -0.2e1 * t75 * t80 * t103 - 0.2e1 * t105 * t110 * t135 + 0.2e1 * t46;
    const double t139 = t74 * t138;
    const double t140 = t54 * t139;
    const double t143 = t110 * t133 * t134;
    const double t145 = 0.2e1 * t74 * t105 * t143;
    const double t149 = 0.1e1 / t11 / t10;
    const double t152 = t147 * t9 * t149 * t45;
    const double t153 = t152 / 0.6e1;
    const double t154 = t40 * t40;
    const double t155 = 0.1e1 / t154;
    const double t156 = t16 * t155;
    const double t157 = 0.1e1 / t23;
    const double t159 = t19 * t157 * t3;
    const double t160 = t9 * t149;
    const double t165 = safe_math::sqrt( t22 );
    const double t167 = t30 * t165 * t3;
    const double t173 = -t159 * t160 / 0.12e2 - t27 * t160 / 0.12e2 - 0.625e-1 * t167 * t160 - t39 * t37 * t55 / 0.3e1;
    const double t174 = 0.1e1 / t44;
    const double t175 = t173 * t174;
    const double t176 = t156 * t175;
    const double t177 = t49 * t48;
    const double t178 = t177 * t53;
    const double t179 = t178 * t139;
    const double t180 = 0.4e1 * t179;
    const double t181 = t52 * t10;
    const double t182 = 0.1e1 / t181;
    const double t183 = t50 * t182;
    const double t184 = t183 * t139;
    const double t185 = 0.4e1 * t184;
    const double t186 = 0.1e1 / t51;
    const double t187 = t48 * t186;
    const double t188 = t55 - t187;
    const double t191 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t61 * t188 );
    const double t192 = -t188;
    const double t195 = piecewise_functor_3( t65, 0.0, 0.4e1 / 0.3e1 * t66 * t192 );
    const double t197 = ( t191 + t195 ) * t73;
    const double t198 = t197 * t138;
    const double t199 = t54 * t198;
    const double t206 = t98 * t98;
    const double t207 = 0.1e1 / t206;
    const double t208 = t80 * t207;
    const double t210 = t83 * t157 * t3;
    const double t216 = t90 * t165 * t3;
    const double t222 = -t210 * t160 / 0.12e2 - t87 * t160 / 0.12e2 - 0.625e-1 * t216 * t160 - t97 * t95 * t55 / 0.3e1;
    const double t223 = 0.1e1 / t102;
    const double t224 = t222 * t223;
    const double t228 = t8 * t149;
    const double t232 = t128 * t128;
    const double t233 = 0.1e1 / t232;
    const double t234 = t110 * t233;
    const double t236 = t113 * t157 * t3;
    const double t242 = t120 * t165 * t3;
    const double t248 = -t236 * t160 / 0.12e2 - t117 * t160 / 0.12e2 - 0.625e-1 * t242 * t160 - t127 * t125 * t55 / 0.3e1;
    const double t249 = 0.1e1 / t132;
    const double t251 = t248 * t249 * t134;
    const double t253 = t201 * t9 * t149 * t103 / 0.6e1 + t208 * t224 - t153 - t176 + t227 * t228 * t135 / 0.6e1 + t234 * t251;
    const double t254 = t74 * t253;
    const double t255 = t54 * t254;
    const double t257 = t197 * t105 * t143;
    const double t258 = 0.2e1 * t257;
    const double t260 = t74 * t259;
    const double t263 = t9 * t149 * t133 * t134;
    const double t264 = t260 * t263;
    const double t265 = t264 / 0.6e1;
    const double t266 = t74 * t110;
    const double t268 = t249 * t134;
    const double t269 = t233 * t248 * t268;
    const double t270 = t266 * t269;
    const double t273 = -t55 - t187;
    const double t276 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t61 * t273 );
    const double t277 = -t273;
    const double t280 = piecewise_functor_3( t65, 0.0, 0.4e1 / 0.3e1 * t66 * t277 );
    const double t282 = ( t276 + t280 ) * t73;
    const double t283 = t282 * t138;
    const double t284 = t54 * t283;
    const double t286 = t282 * t105 * t143;
    const double t287 = 0.2e1 * t286;


    eps = -t47 + t140 + t145;
    vrho_a = -t47 + t140 + t145 + t10 * ( t153 + t176 + t180 - t185 + t199 + t255 + t258 - t265 - t270 );
    vrho_b = -t47 + t140 + t145 + t10 * ( t153 + t176 - t180 - t185 + t284 + t255 + t287 - t265 - t270 );

  }